

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsaaudio.c
# Opt level: O0

int alsa_read(snd_pcm_t *handle,short *buffer,int count)

{
  int iVar1;
  int err;
  int count_local;
  short *buffer_local;
  snd_pcm_t *handle_local;
  
  iVar1 = snd_pcm_readi(handle,buffer,(long)count);
  if (iVar1 == -0x20) {
    snd_pcm_prepare(handle);
  }
  return iVar1;
}

Assistant:

int alsa_read(snd_pcm_t * handle, short *buffer, int count)
{
	int err;

	err = snd_pcm_readi(handle, buffer, count);

	if (err == -EPIPE) {
//		hlog(LOG_ERR, LOGPREFIX "Overrun");
		snd_pcm_prepare(handle);
	} else if (err < 0) {
//		hlog(LOG_ERR, LOGPREFIX "Read error");
	} else if (err != count) {
//		hlog(LOG_INFO, LOGPREFIX "Short read, read %d frames", err);
	} else {
		/*hlog(LOG_DEBUG, LOGPREFIX "Read %d samples", err); */
	}
	
	return err;
}